

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

int __thiscall QDir::remove(QDir *this,char *__filename)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  QMessageLogger *in_stack_ffffffffffffff80;
  char *__filename_00;
  byte local_41;
  char local_40 [8];
  QString *in_stack_ffffffffffffffc8;
  QDir *in_stack_ffffffffffffffd0;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x281a5a);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff80,
               (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
    QMessageLogger::warning(&local_28,"QDir::remove: Empty or null file name");
    local_41 = 0;
  }
  else {
    __filename_00 = local_40;
    filePath(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    iVar2 = QFile::remove(__filename_00);
    local_41 = (byte)iVar2 & 1;
    QString::~QString((QString *)0x281aca);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_41);
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::remove(const QString &fileName)
{
    if (fileName.isEmpty()) {
        qWarning("QDir::remove: Empty or null file name");
        return false;
    }
    return QFile::remove(filePath(fileName));
}